

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

void Gia_ManCorrRemapSimInfo(Gia_Man_t *p,Vec_Ptr_t *vInfo)

{
  int iVar1;
  void **ppvVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  
  if (1 < vInfo->nSize) {
    uVar10 = (ulong)(uint)p->nRegs;
    if (0 < p->nRegs) {
      ppvVar2 = vInfo->pArray;
      pVVar3 = p->vCis;
      uVar6 = (uint)((ulong)((long)ppvVar2[1] - (long)*ppvVar2) >> 2);
      lVar9 = 0;
      do {
        iVar1 = pVVar3->nSize;
        iVar7 = iVar1 - (int)uVar10;
        uVar8 = (int)lVar9 + iVar7;
        if (((int)uVar8 < 0) || (iVar1 <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVVar3->pArray[uVar8];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00640634:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return;
        }
        uVar10 = (ulong)(uint)p->pReprs[iVar1] & 0xfffffff;
        if (uVar10 == 0xfffffff) {
          pGVar11 = (Gia_Obj_t *)0x0;
        }
        else {
          if (p->nObjs <= (int)uVar10) goto LAB_00640634;
          pGVar11 = p->pObjs + uVar10;
        }
        if ((SUB41(p->pReprs[iVar1],3) >> 5 & 1) == 0 && pGVar11 != (Gia_Obj_t *)0x0) {
          if (vInfo->nSize <= lVar9) goto LAB_00640672;
          pvVar4 = ppvVar2[lVar9];
          if (0 < (int)uVar6) {
            uVar10 = 0;
            do {
              if (*(int *)((long)pvVar4 + uVar10 * 4) != 0) {
                __assert_fail("pInfoObj[w] == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                              ,0x151,"void Gia_ManCorrRemapSimInfo(Gia_Man_t *, Vec_Ptr_t *)");
              }
              uVar10 = uVar10 + 1;
            } while ((uVar6 & 0x7fffffff) != uVar10);
          }
          uVar10 = *(ulong *)pGVar11;
          if ((~uVar10 & 0x1fffffff1fffffff) != 0) {
            if (((~(uint)uVar10 & 0x9fffffff) != 0) ||
               (uVar8 = (uint)(uVar10 >> 0x20), (int)(uVar8 & 0x1fffffff) < iVar7)) {
              __assert_fail("Gia_ObjIsRo(p, pRepr)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                            ,0x155,"void Gia_ManCorrRemapSimInfo(Gia_Man_t *, Vec_Ptr_t *)");
            }
            uVar8 = (uVar8 & 0x1fffffff) - iVar7;
            if (((int)uVar8 < 0) || (vInfo->nSize <= (int)uVar8)) goto LAB_00640672;
            if (0 < (int)uVar6) {
              pvVar5 = ppvVar2[uVar8];
              uVar10 = 0;
              do {
                *(undefined4 *)((long)pvVar4 + uVar10 * 4) =
                     *(undefined4 *)((long)pvVar5 + uVar10 * 4);
                uVar10 = uVar10 + 1;
              } while ((uVar6 & 0x7fffffff) != uVar10);
            }
          }
        }
        lVar9 = lVar9 + 1;
        uVar10 = (ulong)p->nRegs;
      } while (lVar9 < (long)uVar10);
    }
    return;
  }
LAB_00640672:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Gia_ManCorrRemapSimInfo( Gia_Man_t * p, Vec_Ptr_t * vInfo )
{
    Gia_Obj_t * pObj, * pRepr;
    unsigned * pInfoObj, * pInfoRepr;
    int i, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    Gia_ManForEachRo( p, pObj, i )
    {
        // skip ROs without representatives
        pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
        if ( pRepr == NULL || Gia_ObjFailed(p, Gia_ObjId(p,pObj)) )
            continue;
        pInfoObj = (unsigned *)Vec_PtrEntry( vInfo, i );
        for ( w = 0; w < nWords; w++ )
            assert( pInfoObj[w] == 0 );
        // skip ROs with constant representatives
        if ( Gia_ObjIsConst0(pRepr) )
            continue;
        assert( Gia_ObjIsRo(p, pRepr) );
//        Abc_Print( 1, "%d -> %d    ", i, Gia_ObjId(p, pRepr) );
        // transfer info from the representative
        pInfoRepr = (unsigned *)Vec_PtrEntry( vInfo, Gia_ObjCioId(pRepr) - Gia_ManPiNum(p) );
        for ( w = 0; w < nWords; w++ )
            pInfoObj[w] = pInfoRepr[w];
    }
//    Abc_Print( 1, "\n" );
}